

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_expression.hpp
# Opt level: O0

string * duckdb::ComparisonExpression::
         ToString<duckdb::BoundComparisonExpression,duckdb::Expression>
                   (BoundComparisonExpression *entry)

{
  pointer pEVar1;
  BaseExpression *in_RSI;
  string *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffff30;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [23];
  ExpressionType in_stack_ffffffffffffffaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"(%s %s %s)",(allocator *)&stack0xffffffffffffffcf);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(local_68);
  BaseExpression::GetExpressionType(in_RSI);
  ExpressionTypeToOperator_abi_cxx11_(in_stack_ffffffffffffffaf);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(local_a8);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  ::std::__cxx11::string::~string(local_a8);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return in_RDI;
}

Assistant:

static string ToString(const T &entry) {
		return StringUtil::Format("(%s %s %s)", entry.left->ToString(),
		                          ExpressionTypeToOperator(entry.GetExpressionType()), entry.right->ToString());
	}